

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O3

char * get_header(mg_header *hdr,int num_hdr,char *name)

{
  int iVar1;
  int iVar2;
  __int32_t **pp_Var3;
  ulong uVar4;
  long lVar5;
  
  if (num_hdr < 1) {
    return (char *)0x0;
  }
  pp_Var3 = __ctype_tolower_loc();
  uVar4 = 0;
  do {
    lVar5 = 0;
    do {
      iVar1 = (*pp_Var3)[(byte)name[lVar5]];
      iVar2 = (*pp_Var3)[(byte)hdr[uVar4].name[lVar5]];
      if (name[lVar5] == 0) break;
      lVar5 = lVar5 + 1;
    } while (iVar1 == iVar2);
    if (iVar1 == iVar2) {
      return hdr[uVar4].value;
    }
    uVar4 = uVar4 + 1;
    if (uVar4 == (uint)num_hdr) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

static const char *
get_header(const struct mg_header *hdr, int num_hdr, const char *name)
{
	int i;
	for (i = 0; i < num_hdr; i++) {
		if (!mg_strcasecmp(name, hdr[i].name)) {
			return hdr[i].value;
		}
	}

	return NULL;
}